

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onConnect(Connection *this,ConnectRequest *request)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  Connection *pCVar1;
  Own<kj::HttpService,_std::nullptr_t> *attachments;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar2;
  HttpOutputStream *this_01;
  size_t sVar3;
  char *pcVar4;
  HttpService *pHVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  SourceLocation location;
  bool bVar13;
  LoopResult LVar14;
  coroutine_handle<void> handle;
  undefined8 *in_RDX;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *pPVar15;
  PromiseAwaiter<void> *pPVar16;
  Own<kj::HttpService,_std::nullptr_t> local_78;
  undefined8 local_68;
  Own<kj::HttpService,_std::nullptr_t> *local_58;
  Fault local_50;
  PromiseBase local_48;
  OwnOwn<kj::HttpService,_std::nullptr_t> _kj_result;
  
  handle._M_fr_ptr = operator_new(0xbf0);
  *(code **)handle._M_fr_ptr = onConnect;
  *(code **)((long)handle._M_fr_ptr + 8) = onConnect;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)handle._M_fr_ptr + 0x10);
  *(ConnectRequest **)((long)handle._M_fr_ptr + 0xbe0) = request;
  local_78.disposer = (Disposer *)0x43b3c6;
  local_78.ptr = (HttpService *)0x43dc9e;
  local_68 = 0x1b00001deb;
  location.function = "onConnect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1deb;
  location.columnNumber = 0x1b;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::Coroutine(this_00,handle,location);
  local_48.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::get_return_object
            ((Coroutine<kj::HttpServer::Connection::LoopResult> *)this);
  local_78.disposer = (Disposer *)CONCAT44(local_78.disposer._4_4_,2);
  kj::_::NullableValue<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>::
  emplace<kj::OneOf<kj::HttpMethod,kj::HttpConnectMethod>>
            ((NullableValue<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> *)
             &request[0x14].authority.content.size_,
             (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)&local_78);
  sVar3 = request[8].authority.content.size_;
  if (*(ulong *)(sVar3 + 0x58) < 2) {
    if (*(ulong *)(sVar3 + 0x68) < 2) {
      local_58 = (Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb70);
      uVar9 = *(undefined4 *)in_RDX;
      uVar10 = *(undefined4 *)((long)in_RDX + 4);
      uVar11 = *(undefined4 *)(in_RDX + 1);
      uVar12 = *(undefined4 *)((long)in_RDX + 0xc);
      *(undefined4 *)((long)handle._M_fr_ptr + 0xb40) = 2;
      *(undefined4 *)((long)handle._M_fr_ptr + 0xb50) = uVar9;
      *(undefined4 *)((long)handle._M_fr_ptr + 0xb54) = uVar10;
      *(undefined4 *)((long)handle._M_fr_ptr + 0xb58) = uVar11;
      *(undefined4 *)((long)handle._M_fr_ptr + 0xb5c) = uVar12;
      *(ConnectRequest **)((long)handle._M_fr_ptr + 0xb60) = request + 8;
      *(ConnectRequest **)((long)handle._M_fr_ptr + 0xb68) = request;
      pcVar4 = request[3].authority.content.ptr;
      (*(code *)**(undefined8 **)pcVar4)(local_58,pcVar4,(long)handle._M_fr_ptr + 0xb40);
      if (*(char *)((long)&request[0x16].authority.content.ptr + 6) == '\x01') {
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                        *)this_00,BREAK_LOOP_CONN_ERR);
      }
      else {
        _kj_result.value.disposer = *(Disposer **)((long)handle._M_fr_ptr + 0xb70);
        pHVar5 = *(HttpService **)((long)handle._M_fr_ptr + 0xb78);
        *(undefined8 *)((long)handle._M_fr_ptr + 0xb78) = 0;
        if (pHVar5 == (HttpService *)0x0) {
          _kj_result.value.ptr = pHVar5;
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                    (&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x1e13,FAILED,"kj::mv(maybeService) != nullptr",
                     "\"SuspendableHttpServiceFactory did not suspend, but returned kj::none.\"",
                     (char (*) [70])
                     "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
          kj::_::Debug::Fault::fatal(&local_50);
        }
        _kj_result.value.ptr = (HttpService *)0x0;
        local_78.disposer = _kj_result.value.disposer;
        local_78.ptr = pHVar5;
        Own<kj::HttpService,_std::nullptr_t>::dispose(&_kj_result.value);
        *(Disposer **)((long)handle._M_fr_ptr + 0xb80) = local_78.disposer;
        *(HttpService **)((long)handle._M_fr_ptr + 0xb88) = local_78.ptr;
        local_78.ptr = (HttpService *)0x0;
        Own<kj::HttpService,_std::nullptr_t>::dispose(&local_78);
        getConnectStream((Connection *)((long)handle._M_fr_ptr + 0xb90));
        uVar6 = *in_RDX;
        uVar7 = in_RDX[1];
        *(undefined1 *)((long)handle._M_fr_ptr + 0xba0) = 0;
        *(undefined8 *)((long)handle._M_fr_ptr + 0xba8) = 0;
        attachments = (Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xbc8);
        (**(code **)(**(long **)((long)handle._M_fr_ptr + 0xb88) + 8))
                  (attachments,*(long **)((long)handle._M_fr_ptr + 0xb88),uVar6,uVar7,request + 8,
                   *(undefined8 *)((long)handle._M_fr_ptr + 0xb98),
                   &(request->authority).content.size_,(long)handle._M_fr_ptr + 0xba0);
        pOVar2 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0xbd0)
        ;
        Promise<void>::
        attach<kj::Own<kj::HttpService,decltype(nullptr)>,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                  ((Promise<void> *)pOVar2,attachments,
                   (Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb80));
        pPVar16 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x5a8);
        co_await<void>(pPVar16,(Promise<void> *)pOVar2);
        *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 2;
        bVar13 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar16,(CoroutineBase *)this_00);
        if (bVar13) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_48.node.ptr;
        }
        kj::_::PromiseAwaiter<void>::await_resume(pPVar16);
        kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar16);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar2);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
        lVar8 = *(long *)((long)handle._M_fr_ptr + 0xbe0);
        if (*(char *)(lVar8 + 0x178) == '\x01') {
          pOVar2 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                   ((long)handle._M_fr_ptr + 0xbc0);
          pOVar2->ptr = *(PromiseNode **)(lVar8 + 0x180);
          *(undefined8 *)(lVar8 + 0x180) = 0;
          Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_>::operator=
                    ((Maybe<kj::Promise<kj::HttpServer::Connection::LoopResult>_> *)(lVar8 + 0x178))
          ;
          pPVar15 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                    ((long)handle._M_fr_ptr + 0x918);
          co_await<kj::HttpServer::Connection::LoopResult>
                    (pPVar15,(Promise<kj::HttpServer::Connection::LoopResult> *)pOVar2);
          *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 3;
          bVar13 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                             ((PromiseAwaiterBase *)pPVar15,(CoroutineBase *)this_00);
          if (bVar13) {
            return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_48.node.ptr
            ;
          }
          LVar14 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                             (pPVar15);
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_00,LVar14);
          kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar15);
          Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar2);
        }
        else {
          if (*(char *)(lVar8 + 0x141) == '\0') {
            this_01 = (HttpOutputStream *)((long)handle._M_fr_ptr + 3000);
            anon_unknown_36::HttpOutputStream::flush(this_01);
            pPVar16 = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x760);
            co_await<void>(pPVar16,(Promise<void> *)this_01);
            *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 4;
            bVar13 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                               ((PromiseAwaiterBase *)pPVar16,(CoroutineBase *)this_00);
            if (bVar13) {
              return (Promise<kj::HttpServer::Connection::LoopResult>)
                     (PromiseNode *)local_48.node.ptr;
            }
            kj::_::PromiseAwaiter<void>::await_resume(pPVar16);
            kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar16);
            Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                      ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)this_01);
          }
          kj::_::
          CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
          ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                          *)this_00,BREAK_LOOP_CONN_ERR);
        }
        Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
                  ((Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb90));
        Own<kj::HttpService,_std::nullptr_t>::dispose
                  ((Own<kj::HttpService,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0xb80));
      }
      Own<kj::HttpService,_std::nullptr_t>::dispose(local_58);
    }
    else {
      pCVar1 = (Connection *)((long)handle._M_fr_ptr + 0xbd8);
      *(undefined4 *)((long)handle._M_fr_ptr + 0xb08) = 400;
      *(char **)((long)handle._M_fr_ptr + 0xb10) = "Bad Request";
      *(undefined8 *)((long)handle._M_fr_ptr + 0xb18) = 0xc;
      *(char **)((long)handle._M_fr_ptr + 0xb20) = "Bad Request";
      *(undefined8 *)((long)handle._M_fr_ptr + 0xb28) = 0xc;
      *(undefined8 *)((long)handle._M_fr_ptr + 0xb30) = 0;
      *(undefined8 *)((long)handle._M_fr_ptr + 0xb38) = 0;
      sendError(pCVar1,*(ProtocolError *)((long)handle._M_fr_ptr + 0xb08));
      pPVar15 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                ((long)handle._M_fr_ptr + 0x3f0);
      co_await<kj::HttpServer::Connection::LoopResult>
                (pPVar15,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar1);
      *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 1;
      bVar13 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)pPVar15,(CoroutineBase *)this_00);
      if (bVar13) {
        return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_48.node.ptr;
      }
      LVar14 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar15);
      kj::_::
      CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
      ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                      *)this_00,LVar14);
      kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar15);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pCVar1);
    }
  }
  else {
    pCVar1 = (Connection *)((long)handle._M_fr_ptr + 0xbb0);
    *(undefined4 *)((long)handle._M_fr_ptr + 0xad0) = 400;
    *(char **)((long)handle._M_fr_ptr + 0xad8) = "Bad Request";
    *(undefined8 *)((long)handle._M_fr_ptr + 0xae0) = 0xc;
    *(char **)((long)handle._M_fr_ptr + 0xae8) = "Bad Request";
    *(undefined8 *)((long)handle._M_fr_ptr + 0xaf0) = 0xc;
    *(undefined8 *)((long)handle._M_fr_ptr + 0xaf8) = 0;
    *(undefined8 *)((long)handle._M_fr_ptr + 0xb00) = 0;
    sendError(pCVar1,*(ProtocolError *)((long)handle._M_fr_ptr + 0xad0));
    pPVar15 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
              ((long)handle._M_fr_ptr + 0x238);
    co_await<kj::HttpServer::Connection::LoopResult>
              (pPVar15,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 0;
    bVar13 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar15,(CoroutineBase *)this_00);
    if (bVar13) {
      return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_48.node.ptr;
    }
    LVar14 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar15);
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
    ::return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>,_kj::HttpServer::Connection::LoopResult>
                    *)this_00,LVar14);
    kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::~PromiseAwaiter(pPVar15);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)pCVar1);
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0xbe8) = 5;
  return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_48.node.ptr;
}

Assistant:

kj::Promise<LoopResult> onConnect(HttpHeaders::ConnectRequest& request) {
    auto& headers = httpInput.getHeaders();

    currentMethod = HttpConnectMethod();

    // The HTTP specification says that CONNECT requests have no meaningful payload
    // but stops short of saying that CONNECT *cannot* have a payload. Implementations
    // can choose to either accept payloads or reject them. We choose to reject it.
    // Specifically, if there are Content-Length or Transfer-Encoding headers in the
    // request headers, we'll automatically reject the CONNECT request.
    //
    // The key implication here is that any data that immediately follows the headers
    // block of the CONNECT request is considered to be part of the tunnel if it is
    // established.

    if (headers.get(HttpHeaderId::CONTENT_LENGTH) != kj::none) {
      co_return co_await sendError(HttpHeaders::ProtocolError {
        400,
        "Bad Request"_kj,
        "Bad Request"_kj,
        nullptr,
      });
    }
    if (headers.get(HttpHeaderId::TRANSFER_ENCODING) != kj::none) {
      co_return co_await sendError(HttpHeaders::ProtocolError {
        400,
        "Bad Request"_kj,
        "Bad Request"_kj,
        nullptr,
      });
    }

    SuspendableRequest suspendable(*this, HttpConnectMethod(), request.authority, headers);
    auto maybeService = factory(suspendable);

    if (suspended) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    auto service = KJ_ASSERT_NONNULL(kj::mv(maybeService),
        "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
    auto connectStream = getConnectStream();
    co_await service->connect(
        request.authority, headers, *connectStream, *this, {})
        .attach(kj::mv(service), kj::mv(connectStream));


    KJ_IF_SOME(p, tunnelRejected) {
      // reject() was called to reject a CONNECT attempt.
      // Finish sending and close the connection.
      auto promise = kj::mv(p);
      tunnelRejected = kj::none;
      co_return co_await promise;
    }

    if (httpOutput.isBroken()) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    co_await httpOutput.flush();
    co_return BREAK_LOOP_CONN_ERR;
  }